

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall
ON_Plane::Rotate(ON_Plane *this,double sin_angle,double cos_angle,ON_3dVector *axis,
                ON_3dPoint *center)

{
  ON_3dPoint center_00;
  bool bVar1;
  ON_3dVector local_130;
  ON_3dVector local_118;
  ON_3dVector local_100;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [8];
  ON_Xform rot;
  bool rc;
  ON_3dPoint *center_local;
  ON_3dVector *axis_local;
  double cos_angle_local;
  double sin_angle_local;
  ON_Plane *this_local;
  
  rot.m_xform[3][3]._7_1_ = 0;
  ON_Xform::ON_Xform((ON_Xform *)local_b8);
  bVar1 = ON_3dPoint::operator==(center,&this->origin);
  if (bVar1) {
    local_d0 = axis->x;
    local_c8 = axis->y;
    local_c0 = axis->z;
    local_e8 = ON_3dPoint::Origin.x;
    local_e0 = ON_3dPoint::Origin.y;
    local_d8 = ON_3dPoint::Origin.z;
    center_00.y = ON_3dPoint::Origin.y;
    center_00.x = ON_3dPoint::Origin.x;
    center_00.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation((ON_Xform *)local_b8,sin_angle,cos_angle,*axis,center_00);
    ON_Xform::operator*(&local_100,(ON_Xform *)local_b8,&this->xaxis);
    (this->xaxis).x = local_100.x;
    (this->xaxis).y = local_100.y;
    (this->xaxis).z = local_100.z;
    ON_Xform::operator*(&local_118,(ON_Xform *)local_b8,&this->yaxis);
    (this->yaxis).x = local_118.x;
    (this->yaxis).y = local_118.y;
    (this->yaxis).z = local_118.z;
    bVar1 = ON_3dVector::operator==(axis,&this->zaxis);
    if (!bVar1) {
      ON_Xform::operator*(&local_130,(ON_Xform *)local_b8,&this->zaxis);
      (this->zaxis).x = local_130.x;
      (this->zaxis).y = local_130.y;
      (this->zaxis).z = local_130.z;
    }
    rot.m_xform[3][3]._7_1_ = UpdateEquation(this);
  }
  else {
    ON_Xform::Rotation((ON_Xform *)local_b8,sin_angle,cos_angle,*axis,*center);
    rot.m_xform[3][3]._7_1_ = Transform(this,(ON_Xform *)local_b8);
  }
  return (bool)rot.m_xform[3][3]._7_1_;
}

Assistant:

bool ON_Plane::Rotate(
      double sin_angle,          // sin(angle)
      double cos_angle,          // cos(angle)
      const ON_3dVector& axis, // axis of rotation
      const ON_3dPoint& center // center of rotation
      )
{
  bool rc = false;
  ON_Xform rot;
  if ( center == origin ) {
    rot.Rotation( sin_angle, cos_angle, axis, ON_3dPoint::Origin );
    xaxis = rot*xaxis;
    yaxis = rot*yaxis;
    if ( !(axis == zaxis) )
      zaxis = rot*zaxis;
    rc = UpdateEquation();
  }
  else {
    rot.Rotation( sin_angle, cos_angle, axis, center );
    rc = Transform( rot );
  }
  return rc;
}